

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O1

Matrix_Dense<double,_0UL,_0UL> *
Disa::operator*(Matrix_Dense<double,_0UL,_0UL> *__return_storage_ptr__,Scalar *scalar,
               Matrix_Dense<double,_0UL,_0UL> *matrix)

{
  pointer pVVar1;
  double *pdVar2;
  Vector_Dense<double,_0UL> *element;
  pointer pVVar3;
  double *pdVar4;
  
  pVVar1 = (matrix->
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ).
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pVVar3 = (matrix->
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ).
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar3 != pVVar1; pVVar3 = pVVar3 + 1) {
    pdVar2 = (pVVar3->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (pdVar4 = (pVVar3->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
      *pdVar4 = *scalar * *pdVar4;
    }
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  vector(&__return_storage_ptr__->
          super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         ,&matrix->
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
        );
  return __return_storage_ptr__;
}

Assistant:

constexpr Matrix_Dense<_type, _row, _col> operator*(const Scalar& scalar, Matrix_Dense<_type, _row, _col> matrix) {
  return matrix *= scalar;
}